

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O0

QToken * filter_qtoken(QToken *token,uint32_t off,TokenValidator *is_ok)

{
  bool bVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  QToken *in_RSI;
  function<bool_(unsigned_int,_unsigned_char)> *in_RDI;
  uint8_t val;
  const_iterator __end1;
  const_iterator __begin1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> possible_values;
  undefined4 in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  function<bool_(unsigned_int,_unsigned_char)> *__x;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_58 [3];
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_40;
  QToken *local_10;
  
  __x = in_RDI;
  local_10 = in_RSI;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1b8af4);
  this = QToken::possible_values(local_10);
  local_40 = this;
  local_58[0]._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)), bVar1
        ) {
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator*(local_58);
    bVar1 = std::function<bool_(unsigned_int,_unsigned_char)>::operator()
                      (in_RDI,in_stack_ffffffffffffff7c,
                       (uchar)((uint)in_stack_ffffffffffffff78 >> 0x18));
    in_stack_ffffffffffffff7c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff7c);
    if (bVar1) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (this,(value_type_conflict1 *)__x);
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator++(local_58);
  }
  QToken::with_values((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this);
  return (QToken *)__x;
}

Assistant:

QToken filter_qtoken(const QToken &token, uint32_t off,
                     const TokenValidator &is_ok) {
    std::vector<uint8_t> possible_values;
    for (uint8_t val : token.possible_values()) {
        if (is_ok(off, val)) {
            possible_values.push_back(val);
        }
    }
    return QToken::with_values(std::move(possible_values));
}